

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem-test.cc
# Opt level: O2

void __thiscall ProblemTest_MutObjective_Test::TestBody(ProblemTest_MutObjective_Test *this)

{
  pointer pBVar1;
  pointer pLVar2;
  BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *actual;
  char *pcVar3;
  int *expected;
  int i;
  long lVar4;
  MutObjective MVar5;
  AssertHelper local_3d8;
  AssertHelper local_3d0;
  AssertionResult gtest_ar;
  MutObjective local_3b8;
  AssertHelper local_3a8;
  double coefs [1];
  int num_terms;
  int indices [1];
  NumericConstant expr;
  Problem p;
  
  mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblem(&p);
  mp::BasicProblem<mp::BasicProblemParams<int>_>::AddObj(&p,MIN,0);
  MVar5 = mp::BasicProblem<mp::BasicProblemParams<int>_>::obj(&p,0);
  local_3b8.
  super_BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
  .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_ =
       MVar5.
       super_BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
       .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_;
  local_3b8.
  super_BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
  .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_ =
       MVar5.
       super_BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
       .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_;
  expr = mp::BasicExprFactory<std::allocator<char>_>::MakeNumericConstant(&p.super_ExprFactory,42.0)
  ;
  mp::BasicProblem<mp::BasicProblemParams<int>_>::MutObjective::set_nonlinear_expr
            (&local_3b8,
             (NumericExpr)
             expr.super_BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1>.super_ExprBase.impl_);
  pBVar1 = ((local_3b8.
             super_BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
             .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_)->
           nonlinear_objs_).
           super__Vector_base<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)(long)local_3b8.
                   super_BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                   .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_ <
      (ulong)((long)((local_3b8.
                      super_BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                      .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.
                     problem_)->nonlinear_objs_).
                    super__Vector_base<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar1 >> 3)) {
    coefs[0] = (double)pBVar1[local_3b8.
                              super_BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                              .
                              super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>
                              .index_].super_ExprBase.impl_;
  }
  else {
    coefs[0] = 0.0;
  }
  actual = (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)coefs;
  testing::internal::
  CmpHelperEQ<mp::NumericConstant,mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
            ((internal *)&gtest_ar,"expr","obj.nonlinear_expr()",&expr,actual);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)coefs);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",
               0x11e,pcVar3);
    testing::internal::AssertHelper::operator=(&local_3d0,(Message *)coefs);
    testing::internal::AssertHelper::~AssertHelper(&local_3d0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)coefs);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  mp::LinearExpr::AddTerm
            (((local_3b8.
               super_BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
               .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_)->
             linear_objs_).super__Vector_base<mp::LinearExpr,_std::allocator<mp::LinearExpr>_>.
             _M_impl.super__Vector_impl_data._M_start +
             local_3b8.
             super_BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
             .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_,0xb,2.2
            );
  indices[0] = 0xb;
  coefs[0] = 2.2;
  num_terms = 1;
  local_3d0.data_._0_4_ =
       *(undefined4 *)
        ((long)&((local_3b8.
                  super_BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                  .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_)
                ->linear_objs_).super__Vector_base<mp::LinearExpr,_std::allocator<mp::LinearExpr>_>.
                _M_impl.super__Vector_impl_data._M_start
                [local_3b8.
                 super_BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                 .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_].
                terms_.super_small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U>.m_data +
        0x10);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"num_terms","obj.linear_expr().num_terms()",&num_terms,
             (int *)&local_3d0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_3d0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",
               0x122,pcVar3);
    testing::internal::AssertHelper::operator=(&local_3d8,(Message *)&local_3d0);
    testing::internal::AssertHelper::~AssertHelper(&local_3d8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3d0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_3d0.data_ =
       *(AssertHelperData **)
        &((local_3b8.
           super_BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
           .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_)->
         linear_objs_).super__Vector_base<mp::LinearExpr,_std::allocator<mp::LinearExpr>_>._M_impl.
         super__Vector_impl_data._M_start
         [local_3b8.
          super_BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
          .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_].terms_.
         super_small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U>.m_data;
  expected = indices;
  for (lVar4 = 0; lVar4 < num_terms; lVar4 = lVar4 + 1) {
    local_3d8.data_._0_4_ = (local_3d0.data_)->type;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&gtest_ar,"indices[i]","it->var_index()",expected,(int *)&local_3d8);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_3d8);
      pcVar3 = "";
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_3a8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",
                 0x122,pcVar3);
      testing::internal::AssertHelper::operator=(&local_3a8,(Message *)&local_3d8);
      testing::internal::AssertHelper::~AssertHelper(&local_3a8);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_3d8);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    local_3d8.data_ = (AssertHelperData *)(local_3d0.data_)->file;
    testing::internal::CmpHelperEQ<double,double>
              ((internal *)&gtest_ar,"coefs[i]","it->coef()",(double *)actual,(double *)&local_3d8);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_3d8);
      pcVar3 = "";
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_3a8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",
                 0x122,pcVar3);
      testing::internal::AssertHelper::operator=(&local_3a8,(Message *)&local_3d8);
      testing::internal::AssertHelper::~AssertHelper(&local_3a8);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_3d8);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    local_3d0.data_ = (AssertHelperData *)&(local_3d0.data_)->line;
    actual = actual + 1;
    expected = expected + 1;
  }
  pLVar2 = ((local_3b8.
             super_BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
             .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_)->
           linear_objs_).super__Vector_base<mp::LinearExpr,_std::allocator<mp::LinearExpr>_>._M_impl
           .super__Vector_impl_data._M_start;
  local_3d8.data_ =
       (AssertHelperData *)
       (*(size_ty *)
         ((long)&pLVar2[local_3b8.
                        super_BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                        .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.
                        index_].terms_.
                 super_small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U>.m_data + 0x10) *
        0x10 + *(long *)&pLVar2[local_3b8.
                                super_BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                                .
                                super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>
                                .index_].terms_.
                         super_small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U>.m_data);
  testing::internal::
  CmpHelperEQ<gch::small_vector_iterator<mp::LinearExpr::Term*,long>,gch::small_vector_iterator<mp::LinearExpr::Term_const*,long>>
            ((internal *)&gtest_ar,"obj.linear_expr().end()","it",
             (small_vector_iterator<mp::LinearExpr::Term_*,_long> *)&local_3d8,
             (small_vector_iterator<const_mp::LinearExpr::Term_*,_long> *)&local_3d0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_3d8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",
               0x122,pcVar3);
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)&local_3d8);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3d8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_3d0.data_._0_4_ = 1;
  local_3d8.data_._0_4_ =
       *(undefined4 *)
        ((long)&((local_3b8.
                  super_BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                  .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_)
                ->linear_objs_).super__Vector_base<mp::LinearExpr,_std::allocator<mp::LinearExpr>_>.
                _M_impl.super__Vector_impl_data._M_start
                [local_3b8.
                 super_BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                 .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_].
                terms_.super_small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U>.m_data +
        0x10);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"1","obj.linear_expr().num_terms()",(int *)&local_3d0,
             (int *)&local_3d8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_3d0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",
               0x123,pcVar3);
    testing::internal::AssertHelper::operator=(&local_3d8,(Message *)&local_3d0);
    testing::internal::AssertHelper::~AssertHelper(&local_3d8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3d0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  mp::BasicProblem<mp::BasicProblemParams<int>_>::obj(&p,0);
  mp::BasicProblem<mp::BasicProblemParams<int>_>::~BasicProblem(&p);
  return;
}

Assistant:

TEST(ProblemTest, MutObjective) {
  Problem p;
  p.AddObj(mp::obj::MIN);
  Problem::MutObjective obj = p.obj(0);
  auto expr = p.MakeNumericConstant(42);
  obj.set_nonlinear_expr(expr);
  EXPECT_EQ(expr, obj.nonlinear_expr());
  obj.linear_expr().AddTerm(11, 2.2);
  const int indices[] = {11};
  const double coefs[] = {2.2};
  EXPECT_LINEAR_EXPR(obj.linear_expr(), indices, coefs);
  EXPECT_EQ(1, obj.linear_expr().num_terms());
  const Problem &cp = p;
  Problem::Objective cobj = cp.obj(0);
  cobj = obj;
}